

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::VertexAttributeBindingStateQueryTests::init
          (VertexAttributeBindingStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  char *pcVar4;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_19a;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_152;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_10a;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c8;
  undefined1 local_c2;
  allocator<char> local_c1;
  int verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_7a;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  TestCaseGroup *pTStack_30;
  int verifierNdx;
  TestCaseGroup *indexedGroup;
  TestCaseGroup *local_18;
  TestCaseGroup *attributeGroup;
  VertexAttributeBindingStateQueryTests *this_local;
  
  attributeGroup = (TestCaseGroup *)this;
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"vertex_attrib","Vertex attribute state");
  local_18 = pTVar2;
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"indexed","Indexed state");
  pTStack_30 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTStack_30);
  for (local_34 = 0; pTVar2 = local_18, local_34 < 4; local_34 = local_34 + 1) {
    pTVar3 = (TestNode *)operator_new(0x80);
    local_7a = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"vertex_attrib_binding",&local_79);
    std::operator+(&local_58,&local_78,init::verifiers[local_34].suffix);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::AttributeBindingCase::AttributeBindingCase
              ((AttributeBindingCase *)pTVar3,pCVar1,pcVar4,"Test VERTEX_ATTRIB_BINDING",
               init::verifiers[local_34].type);
    local_7a = 0;
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    pTVar2 = local_18;
    pTVar3 = (TestNode *)operator_new(0x80);
    local_c2 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&verifierNdx_1,"vertex_attrib_relative_offset",&local_c1);
    std::operator+(&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_1,init::verifiers[local_34].suffix);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::AttributeRelativeOffsetCase::AttributeRelativeOffsetCase
              ((AttributeRelativeOffsetCase *)pTVar3,pCVar1,pcVar4,
               "Test VERTEX_ATTRIB_RELATIVE_OFFSET",init::verifiers[local_34].type);
    local_c2 = 0;
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&verifierNdx_1);
    std::allocator<char>::~allocator(&local_c1);
  }
  for (local_c8 = 0; pTVar2 = pTStack_30, local_c8 < 3; local_c8 = local_c8 + 1) {
    pTVar3 = (TestNode *)operator_new(0x80);
    local_10a = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"vertex_binding_divisor_",&local_109);
    std::operator+(&local_e8,&local_108,init()::verifiers[local_c8].name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::VertexBindingDivisorCase::VertexBindingDivisorCase
              ((VertexBindingDivisorCase *)pTVar3,pCVar1,pcVar4,"Test VERTEX_BINDING_DIVISOR",
               init()::verifiers[local_c8].type);
    local_10a = 0;
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    pTVar2 = pTStack_30;
    pTVar3 = (TestNode *)operator_new(0x80);
    local_152 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"vertex_binding_offset_",&local_151);
    std::operator+(&local_130,&local_150,init()::verifiers[local_c8].name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::VertexBindingOffsetCase::VertexBindingOffsetCase
              ((VertexBindingOffsetCase *)pTVar3,pCVar1,pcVar4,"Test VERTEX_BINDING_OFFSET",
               init()::verifiers[local_c8].type);
    local_152 = 0;
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    pTVar2 = pTStack_30;
    pTVar3 = (TestNode *)operator_new(0x80);
    local_19a = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"vertex_binding_stride_",&local_199);
    std::operator+(&local_178,&local_198,init()::verifiers[local_c8].name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::VertexBindingStrideCase::VertexBindingStrideCase
              ((VertexBindingStrideCase *)pTVar3,pCVar1,pcVar4,"Test VERTEX_BINDING_STRIDE",
               init()::verifiers[local_c8].type);
    local_19a = 0;
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    pTVar2 = pTStack_30;
    pTVar3 = (TestNode *)operator_new(0x80);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"vertex_binding_buffer_",&local_1e1);
    std::operator+(&local_1c0,&local_1e0,init()::verifiers[local_c8].name);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::VertexBindingBufferCase::VertexBindingBufferCase
              ((VertexBindingBufferCase *)pTVar3,pCVar1,pcVar4,"Test VERTEX_BINDING_BUFFER",
               init()::verifiers[local_c8].type);
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  anon_unknown_1::MixedVertexBindingDivisorCase::MixedVertexBindingDivisorCase
            ((MixedVertexBindingDivisorCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "vertex_binding_divisor_mixed","Test VERTEX_BINDING_DIVISOR");
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = pTStack_30;
  pTVar3 = (TestNode *)operator_new(0x80);
  anon_unknown_1::MixedVertexBindingOffsetCase::MixedVertexBindingOffsetCase
            ((MixedVertexBindingOffsetCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "vertex_binding_offset_mixed","Test VERTEX_BINDING_OFFSET");
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = pTStack_30;
  pTVar3 = (TestNode *)operator_new(0x80);
  anon_unknown_1::MixedVertexBindingStrideCase::MixedVertexBindingStrideCase
            ((MixedVertexBindingStrideCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "vertex_binding_stride_mixed","Test VERTEX_BINDING_STRIDE");
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  pTVar2 = pTStack_30;
  pTVar3 = (TestNode *)operator_new(0x80);
  anon_unknown_1::MixedVertexBindingBufferCase::MixedVertexBindingBufferCase
            ((MixedVertexBindingBufferCase *)pTVar3,(this->super_TestCaseGroup).m_context,
             "vertex_binding_buffer_mixed","Test VERTEX_BINDING_BUFFER");
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  return extraout_EAX;
}

Assistant:

void VertexAttributeBindingStateQueryTests::init (void)
{
	tcu::TestCaseGroup* const attributeGroup	= new TestCaseGroup(m_context, "vertex_attrib", "Vertex attribute state");
	tcu::TestCaseGroup* const indexedGroup		= new TestCaseGroup(m_context, "indexed", "Indexed state");

	addChild(attributeGroup);
	addChild(indexedGroup);

	// .vertex_attrib
	{
		static const struct Verifier
		{
			const char*		suffix;
			QueryType		type;
		} verifiers[] =
		{
			{ "",						QUERY_ATTRIBUTE_INTEGER					},	// avoid renaming tests
			{ "_getvertexattribfv",		QUERY_ATTRIBUTE_FLOAT					},
			{ "_getvertexattribiiv",	QUERY_ATTRIBUTE_PURE_INTEGER			},
			{ "_getvertexattribiuiv",	QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER	},
		};

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
		{
			attributeGroup->addChild(new AttributeBindingCase		(m_context,	(std::string("vertex_attrib_binding") + verifiers[verifierNdx].suffix).c_str(),			"Test VERTEX_ATTRIB_BINDING",			verifiers[verifierNdx].type));
			attributeGroup->addChild(new AttributeRelativeOffsetCase(m_context,	(std::string("vertex_attrib_relative_offset") + verifiers[verifierNdx].suffix).c_str(),	"Test VERTEX_ATTRIB_RELATIVE_OFFSET",	verifiers[verifierNdx].type));
		}
	}

	// .indexed
	{
		static const struct Verifier
		{
			const char*		name;
			QueryType		type;
		} verifiers[] =
		{
			{ "getintegeri",	QUERY_INDEXED_INTEGER	},
			{ "getintegeri64",	QUERY_INDEXED_INTEGER64	},
			{ "getboolean",		QUERY_INDEXED_BOOLEAN	},
		};

		// states

		for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(verifiers); ++verifierNdx)
		{
			indexedGroup->addChild(new VertexBindingDivisorCase	(m_context, (std::string("vertex_binding_divisor_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_DIVISOR",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingOffsetCase	(m_context, (std::string("vertex_binding_offset_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_OFFSET",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingStrideCase	(m_context, (std::string("vertex_binding_stride_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_STRIDE",	verifiers[verifierNdx].type));
			indexedGroup->addChild(new VertexBindingBufferCase	(m_context, (std::string("vertex_binding_buffer_") + verifiers[verifierNdx].name).c_str(),	"Test VERTEX_BINDING_BUFFER",	verifiers[verifierNdx].type));
		}

		// mixed apis

		indexedGroup->addChild(new MixedVertexBindingDivisorCase(m_context, "vertex_binding_divisor_mixed",	"Test VERTEX_BINDING_DIVISOR"));
		indexedGroup->addChild(new MixedVertexBindingOffsetCase	(m_context, "vertex_binding_offset_mixed",	"Test VERTEX_BINDING_OFFSET"));
		indexedGroup->addChild(new MixedVertexBindingStrideCase	(m_context, "vertex_binding_stride_mixed",	"Test VERTEX_BINDING_STRIDE"));
		indexedGroup->addChild(new MixedVertexBindingBufferCase	(m_context, "vertex_binding_buffer_mixed",	"Test VERTEX_BINDING_BUFFER"));
	}
}